

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFtpCommand.cpp
# Opt level: O0

int __thiscall CSIZECommand::doWhat(CSIZECommand *this,CClient *pClient)

{
  EFTPSTATE EVar1;
  allocator local_10b1;
  undefined1 local_10b0 [8];
  string ret_2;
  undefined1 local_1088 [8];
  string ret_1;
  allocator local_1051;
  undefined1 local_1050 [8];
  string ret;
  long size;
  char buffer [4096];
  CClient *pClient_local;
  CSIZECommand *this_local;
  
  EVar1 = CClient::GetClientState(pClient);
  if ((int)EVar1 < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_10b0,"530 Please login with USER and PASS.\r\n",&local_10b1);
    std::allocator<char>::~allocator((allocator<char> *)&local_10b1);
    CClient::sendMsg(pClient,(string *)local_10b0);
    this_local._4_4_ = -1;
    std::__cxx11::string::~string((string *)local_10b0);
  }
  else {
    bzero(&size,0x1000);
    ret.field_2._8_8_ = GetFileSize(this,pClient);
    if ((long)ret.field_2._8_8_ < 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_1088,"550 Could not get file size.\r\n",
                 (allocator *)(ret_2.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(ret_2.field_2._M_local_buf + 0xf));
      CClient::sendMsg(pClient,(string *)local_1088);
      this_local._4_4_ = -1;
      std::__cxx11::string::~string((string *)local_1088);
    }
    else {
      sprintf((char *)&size,"213 %ld\r\n",ret.field_2._8_8_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_1050,(char *)&size,&local_1051);
      std::allocator<char>::~allocator((allocator<char> *)&local_1051);
      CClient::sendMsg(pClient,(string *)local_1050);
      this_local._4_4_ = 1;
      std::__cxx11::string::~string((string *)local_1050);
    }
  }
  return this_local._4_4_;
}

Assistant:

int CSIZECommand::doWhat(CClient *pClient) {
    if(pClient->GetClientState() >= PASS){
        char buffer[BUFFER_SIZE];
        bzero(buffer,BUFFER_SIZE);
        long size = GetFileSize(pClient);
        if(size >= 0){
            sprintf(buffer,"213 %ld\r\n",size);
            string ret(buffer);
            pClient->sendMsg(ret);
            return 1;
        }
        else{
            string ret = "550 Could not get file size.\r\n";
            pClient->sendMsg(ret);
            return -1;
        }
    }
    else{
        string ret = "530 Please login with USER and PASS.\r\n";
        pClient->sendMsg(ret);
        return -1;
    }
}